

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_lexer.cpp
# Opt level: O0

void __thiscall Lexer::initializeTokenMaps(Lexer *this)

{
  char *pcVar1;
  bool bVar2;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TokenType>_>::value,_pair<iterator,_bool>_>
  _Var3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  int i;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
  *in_stack_ffffffffffffff00;
  value_type *__x;
  allocator *this_00;
  allocator local_a1;
  string local_a0 [32];
  _Base_ptr local_80;
  undefined1 local_78;
  int local_70;
  allocator local_59;
  string local_58 [76];
  int local_c;
  
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                   *)0x113fd5);
  if (bVar2) {
    for (local_c = 0; local_c < 99; local_c = local_c + 1) {
      if ((('`' < *token_strings[local_c]) && (*token_strings[local_c] < '{')) ||
         (*token_strings[local_c] == '_')) {
        pcVar1 = token_strings[local_c];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,pcVar1,&local_59);
        local_70 = local_c;
        std::make_pair<std::__cxx11::string,TokenType>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffef8._M_node,
                   (TokenType *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
        _Var3 = std::
                map<std::__cxx11::string,TokenType,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>>
                ::insert<std::pair<std::__cxx11::string,TokenType>>
                          (in_stack_ffffffffffffff00,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                            *)in_stack_fffffffffffffef8._M_node);
        local_80 = (_Base_ptr)_Var3.first._M_node;
        local_78 = _Var3.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                 *)0x11410c);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        in_stack_ffffffffffffff00 =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
              *)(*(long *)(in_RDI + 0x48) + 0x30);
        __x = (value_type *)token_strings[local_c];
        this_00 = &local_a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,(char *)__x,this_00);
        pVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00,__x);
        in_stack_fffffffffffffef8 = pVar4.first._M_node;
        in_stack_fffffffffffffef7 = pVar4.second;
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
    }
  }
  return;
}

Assistant:

void Lexer::initializeTokenMaps()
{
  if (!tokenIdentStringToType.empty())
    return;

  for (int i = 0; i < int(TOKEN_TYPE_COUNT); i++)
    if ((token_strings[i][0] >= 'a' && token_strings[i][0] <= 'z') || token_strings[i][0] == '_')
    {
      tokenIdentStringToType.insert(std::make_pair<std::string, TokenType>(token_strings[i], TokenType(i)));
      ctx.stringList.insert(token_strings[i]);
    }
}